

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

ComponentHandle<Counter,_entityx::EntityManager> __thiscall
entityx::EntityManager::assign<Counter,int>(EntityManager *this,Id id,int *args)

{
  ComponentHandle<Counter,_entityx::EntityManager> CVar1;
  Counter *this_00;
  vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> *this_01;
  char *pcVar2;
  int __c;
  int __c_00;
  uint *in_RDX;
  Id in_RSI;
  EntityManager *in_RDI;
  EventManager *unaff_retaddr;
  Pool<Counter,_8192UL> *pool;
  Family family;
  ComponentHandle<Counter,_entityx::EntityManager> component;
  Id *this_02;
  undefined1 __val;
  size_t in_stack_ffffffffffffff78;
  Entity local_58;
  uint64_t local_48;
  EntityManager *in_stack_ffffffffffffffc0;
  Id local_18;
  ComponentHandle<Counter,_entityx::EntityManager> *in_stack_fffffffffffffff0;
  Id in_stack_fffffffffffffff8;
  
  local_18.id_ = in_RSI.id_;
  assert_valid(in_RDI,in_RSI);
  component_family<Counter>();
  accomodate_component<Counter>(in_stack_ffffffffffffffc0);
  this_02 = &local_18;
  Entity::Id::index(this_02,(char *)in_RSI.id_,__c);
  this_00 = (Counter *)BasePool::get((BasePool *)in_RDI,in_stack_ffffffffffffff78);
  pcVar2 = (char *)(ulong)*in_RDX;
  Counter::Counter(this_00,*in_RDX);
  this_01 = (vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> *)
            ((BasePool *)in_RDI + 0x48);
  pcVar2 = Entity::Id::index(this_02,pcVar2,__c_00);
  __val = (undefined1)((ulong)this_02 >> 0x38);
  Catch::clara::std::vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>::operator[]
            (this_01,(ulong)pcVar2 & 0xffffffff);
  Catch::clara::std::bitset<64UL>::set((bitset<64UL> *)in_RDI,(size_t)this_01,(bool)__val);
  local_48 = local_18.id_;
  ComponentHandle<Counter,_entityx::EntityManager>::ComponentHandle
            ((ComponentHandle<Counter,_entityx::EntityManager> *)&stack0xfffffffffffffff0,in_RDI,
             local_18);
  Entity::Entity(&local_58,in_RDI,local_18);
  EventManager::
  emit<entityx::ComponentAddedEvent<Counter>,entityx::Entity,entityx::ComponentHandle<Counter,entityx::EntityManager>&>
            (unaff_retaddr,(Entity *)in_stack_fffffffffffffff8.id_,in_stack_fffffffffffffff0);
  CVar1.id_.id_ = in_stack_fffffffffffffff8.id_;
  CVar1.manager_ = (EntityManager *)in_stack_fffffffffffffff0;
  return CVar1;
}

Assistant:

ComponentHandle<C> assign(Entity::Id id, Args && ... args) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    assert(!entity_component_mask_[id.index()].test(family));

    // Placement new into the component pool.
    Pool<C> *pool = accomodate_component<C>();
    ::new(pool->get(id.index())) C(std::forward<Args>(args) ...);

    // Set the bit for this component.
    entity_component_mask_[id.index()].set(family);

    // Create and return handle.
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentAddedEvent<C>>(Entity(this, id), component);
    return component;
  }